

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValueAndRemove
          (BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,InstrByteCodeRegisterUses *value)

{
  uint uVar1;
  int iVar2;
  Type piVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses> *pKVar5;
  undefined6 uVar6;
  uint uVar7;
  Type pSVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint depth;
  
  piVar3 = this->buckets;
  depth = 0;
  if (piVar3 != (Type)0x0) {
    uVar7 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar1 = piVar3[uVar7];
    uVar11 = (ulong)(int)uVar1;
    depth = 0;
    if (-1 < (long)uVar11) {
      pSVar8 = this->entries;
      if (pSVar8[uVar11].
          super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
          super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
          .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.key == *key
         ) {
        depth = 0;
        uVar10 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar10 = uVar1;
          depth = depth + 1;
          uVar1 = pSVar8[uVar10].
                  super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                  super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                  next;
          uVar11 = (ulong)(int)uVar1;
          if ((long)uVar11 < 0) goto LAB_003f0098;
        } while (pSVar8[uVar11].
                 super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                 super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.key
                 != *key);
      }
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
        pSVar8 = this->entries;
      }
      uVar9 = uVar11 & 0xffffffff;
      pKVar5 = &pSVar8[uVar9].
                super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>;
      uVar6 = *(undefined6 *)
               &(pKVar5->
                super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                ).super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.
                value.field_0x2;
      pBVar4 = pSVar8[uVar9].
               super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
               super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
               .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.
               bv;
      value->capturingOpCode =
           (pKVar5->
           super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
           ).super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.
           capturingOpCode;
      *(undefined6 *)&value->field_0x2 = uVar6;
      value->bv = pBVar4;
      pSVar8 = this->entries;
      iVar2 = pSVar8[uVar9].
              super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
              super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
              .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.next;
      if ((int)uVar10 < 0) {
        this->buckets[uVar7] = iVar2;
      }
      else {
        pSVar8[uVar10].
        super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
        super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
        .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.next = iVar2;
      }
      *(undefined8 *)
       &pSVar8[uVar9].
        super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
        super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
        .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value = 0;
      pSVar8[uVar9].
      super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
      super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.value.bv =
           (BVSparse<Memory::JitArenaAllocator> *)0x0;
      pSVar8[uVar9].
      super_DefaultHashedEntry<unsigned_int,_Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Func::InstrByteCodeRegisterUses>.
      super_ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>.key = 0;
      SetNextFreeEntryIndex
                (this,this->entries + uVar9,-(uint)(this->freeCount == 0) | this->freeList);
      this->freeList = (Type)uVar11;
      this->freeCount = this->freeCount + 1;
      if (this->stats == (DictionaryStats *)0x0) {
        return true;
      }
      DictionaryStats::Remove(this->stats,this->buckets[uVar7] == -1);
      return true;
    }
  }
LAB_003f0098:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool TryGetValueAndRemove(const TKey& key, TValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = entries[i].Value();
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }